

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O3

void __thiscall Hand::getFarthestFinger(Hand *this)

{
  pointer pFVar1;
  double dVar2;
  Finger *f;
  pointer pFVar3;
  double local_90;
  Point local_88;
  Point local_80;
  Finger local_78;
  
  Finger::Finger(&local_78);
  pFVar3 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar1 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pFVar3 != pFVar1) {
    local_90 = -1.0;
    do {
      local_80 = pFVar3->ptStart;
      local_88 = pFVar3->ptFar;
      dVar2 = getDist(&local_80,&local_88);
      if (local_90 < dVar2) {
        local_78.ptStart = pFVar3->ptStart;
        local_78.ptEnd = pFVar3->ptEnd;
        local_78.ptFar = pFVar3->ptFar;
        local_78.index = pFVar3->index;
        local_78.hndAngle = pFVar3->hndAngle;
        local_78.depth = pFVar3->depth;
        local_78.maxAngle = pFVar3->maxAngle;
        local_78.minDepth = pFVar3->minDepth;
        local_78.ok = pFVar3->ok;
        local_78.shouldCheckAngles = pFVar3->shouldCheckAngles;
        local_78.shouldCheckDist = pFVar3->shouldCheckDist;
        local_78._39_1_ = pFVar3->field_0x27;
        local_78.boundingBox.x = (pFVar3->boundingBox).x;
        local_78.boundingBox.y = (pFVar3->boundingBox).y;
        local_78.boundingBox.width = (pFVar3->boundingBox).width;
        local_78.boundingBox.height = (pFVar3->boundingBox).height;
        local_90 = dVar2;
      }
      pFVar3 = pFVar3 + 1;
    } while (pFVar3 != pFVar1);
  }
  (this->farthestFinger).ptStart = local_78.ptStart;
  (this->farthestFinger).ptEnd = local_78.ptEnd;
  (this->farthestFinger).ptFar = local_78.ptFar;
  (this->farthestFinger).depth = local_78.depth;
  (this->farthestFinger).maxAngle = local_78.maxAngle;
  (this->farthestFinger).minDepth = local_78.minDepth;
  (this->farthestFinger).ok = local_78.ok;
  (this->farthestFinger).shouldCheckAngles = local_78.shouldCheckAngles;
  (this->farthestFinger).shouldCheckDist = local_78.shouldCheckDist;
  (this->farthestFinger).field_0x27 = local_78._39_1_;
  (this->farthestFinger).index = local_78.index;
  (this->farthestFinger).hndAngle = local_78.hndAngle;
  (this->farthestFinger).boundingBox.x = local_78.boundingBox.x;
  (this->farthestFinger).boundingBox.y = local_78.boundingBox.y;
  (this->farthestFinger).boundingBox.width = local_78.boundingBox.width;
  (this->farthestFinger).boundingBox.height = local_78.boundingBox.height;
  return;
}

Assistant:

void Hand::getFarthestFinger() {
    double farthest = -1;
    double dist;
    Finger ff;
    for (Finger &f : fingers) {
        dist = getDist(f.ptStart, f.ptFar);
        if (dist > farthest) {
            farthest = dist;
            ff = f;
        }
    }
    farthestFinger = ff;
}